

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O0

void Ssw_SmlSavePatternAigPhase(Ssw_Man_t *p,int f)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  int f_local;
  Ssw_Man_t *p_local;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), local_24 < iVar1; local_24 = local_24 + 1)
  {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_24);
    pAVar2 = Ssw_ObjFrame(p,pAVar2,f);
    iVar1 = Aig_ObjPhaseReal(pAVar2);
    if (iVar1 != 0) {
      Abc_InfoSetBit(p->pPatWords,local_24);
    }
  }
  return;
}

Assistant:

void Ssw_SmlSavePatternAigPhase( Ssw_Man_t * p, int f )
{
    Aig_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Aig_ManForEachCi( p->pAig, pObj, i )
        if ( Aig_ObjPhaseReal( Ssw_ObjFrame(p, pObj, f) ) )
            Abc_InfoSetBit( p->pPatWords, i );
}